

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O3

void linker_copy(GlobalVars *gv)

{
  ulong size;
  bool bVar1;
  uint8_t *puVar2;
  Symbol *pSVar3;
  ObjectUnit *ou;
  FILE *__stream;
  LinkedSection *pLVar4;
  long lVar5;
  Section *pSVar6;
  LinkedSection *def_ls;
  ulong uVar7;
  long local_50;
  
  if ((FILE *)gv->trace_file != (FILE *)0x0) {
    fputc(10,(FILE *)gv->trace_file);
  }
  if ((FILE *)gv->map_file != (FILE *)0x0) {
    fputc(10,(FILE *)gv->map_file);
  }
  pLVar4 = (LinkedSection *)(gv->lnksec).first;
  if ((pLVar4->n).next == (node *)0x0) {
    def_ls = (LinkedSection *)0x0;
  }
  else {
    uVar7 = 0;
    def_ls = (LinkedSection *)0x0;
    do {
      if ((((FILE *)gv->trace_file != (FILE *)0x0) &&
          (((pLVar4->sections).first)->next != (node *)0x0)) && (pLVar4->size != 0)) {
        fprintf((FILE *)gv->trace_file,"Copying %s:\n",pLVar4->name);
      }
      size = pLVar4->size;
      if (uVar7 == 0 || uVar7 < size) {
        uVar7 = size;
        def_ls = pLVar4;
      }
      puVar2 = (uint8_t *)alloczero(size);
      pLVar4->data = puVar2;
      pSVar6 = (Section *)(pLVar4->sections).first;
      if ((pSVar6->n).next != (node *)0x0) {
        bVar1 = true;
        local_50 = 0;
        do {
          if ((pLVar4->data != (uint8_t *)0x0) && (pSVar6->data != (uint8_t *)0x0)) {
            memset16(gv,pLVar4->data + local_50,pSVar6->filldata,pSVar6->offset - local_50);
            memcpy(pLVar4->data + pSVar6->offset,pSVar6->data,pSVar6->size);
            local_50 = pSVar6->size + pSVar6->offset;
          }
          if (pSVar6->obj != (ObjectUnit *)0x0) {
            lVar5 = 0;
            do {
              for (pSVar3 = pSVar6->obj->objsyms[lVar5]; pSVar3 != (Symbol *)0x0;
                  pSVar3 = pSVar3->obj_chain) {
                if ((pSVar3->relsect == pSVar6) && ((pSVar3->flags & 10) != 8)) {
                  if (pSVar3->type == '\x02') {
                    pSVar3->value = pSVar3->value + pSVar6->va;
                  }
                  addtail(&pLVar4->symbols,&pSVar3->n);
                  __stream = (FILE *)gv->map_file;
                  if (__stream != (FILE *)0x0) {
                    if (bVar1) {
                      fprintf(__stream,"\nSymbols of %s:\n",pLVar4->name);
                      __stream = (FILE *)gv->map_file;
                    }
                    print_symbol((FILE *)__stream,pSVar3);
                    bVar1 = false;
                  }
                }
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0x20);
          }
          pSVar6 = (Section *)(pSVar6->n).next;
        } while ((pSVar6->n).next != (node *)0x0);
      }
      pLVar4 = (LinkedSection *)(pLVar4->n).next;
    } while ((pLVar4->n).next != (node *)0x0);
    if ((gv->use_ldscript != 0) && (def_ls != (LinkedSection *)0x0)) {
      if ((FILE *)gv->map_file != (FILE *)0x0) {
        fwrite("\nLinker symbols:\n",0x11,1,(FILE *)gv->map_file);
      }
      pSVar3 = (Symbol *)remhead(&gv->scriptsymbols);
      if (pSVar3 != (Symbol *)0x0) {
        do {
          if ((pSVar3->flags & 10) != 8) {
            pSVar3->relsect = (Section *)(def_ls->sections).first;
            addtail(&def_ls->symbols,&pSVar3->n);
            if (gv->map_file != (FILE *)0x0) {
              print_symbol(gv->map_file,pSVar3);
            }
          }
          pSVar3 = (Symbol *)remhead(&gv->scriptsymbols);
        } while (pSVar3 != (Symbol *)0x0);
      }
    }
  }
  fixlnksymbols(gv,def_ls);
  for (ou = (ObjectUnit *)(gv->selobjects).first; (ou->n).next != (node *)0x0;
      ou = (ObjectUnit *)(ou->n).next) {
    fixstabs(ou);
  }
  return;
}

Assistant:

void linker_copy(struct GlobalVars *gv)
/* Merge contents of linked sections, fix symbol offsets and
   allocate common symbol data. */
{
  struct LinkedSection *ls,*maxls=NULL;
  struct Section *sec;
  unsigned long maxsize = 0;
  struct Symbol *sym;
  struct ObjectUnit *obj;

  if (gv->trace_file)
    fprintf(gv->trace_file,"\n");
  if (gv->map_file)
    fprintf(gv->map_file,"\n");

  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    bool print_symbols_of_header = TRUE;
    unsigned long lastsecend = 0;  /* for filling gaps */

    if (gv->trace_file) {
      if (!listempty(&ls->sections) && ls->size>0)
        fprintf(gv->trace_file,"Copying %s:\n",ls->name);
    }
    if (ls->size>maxsize || maxsize==0) {  /* finds largest section */
      maxsize = ls->size;
      maxls = ls;
    }
    /* allocate memory for section, even for uninitialized ones */
    ls->data = alloczero(ls->size);

    for (sec=(struct Section *)ls->sections.first;
         sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
      int i;

      if (ls->data && sec->data) {
        /* copy section contents, fill gaps */
        memset16(gv,ls->data + lastsecend,sec->filldata,
                 sec->offset - lastsecend);
        memcpy(ls->data+sec->offset,sec->data,sec->size);
        lastsecend = sec->offset + sec->size;
      }

      if (sec->obj) {
        /* find section symbols and fix their offsets */
        for (i=0; i<OBJSYMHTABSIZE; i++) {
          for (sym=sec->obj->objsyms[i]; sym; sym=sym->obj_chain) {
            if (sym->relsect == sec) {
#if 0
              if (sym->type==SYM_COMMON &&
                  (!gv->dest_object || gv->alloc_common)) {
                /* delete remaining copies of common symbols */
                remove_obj_symbol(sym);
              }
#endif
              if (!((sym->flags & (SYMF_REFERENCED|SYMF_PROVIDED))
                    == SYMF_PROVIDED)) { /* ignore unrefd. provided sym. */
                if (sym->type == SYM_RELOC)
                  sym->value += sec->va;  /* was sec->offset */
                addtail(&ls->symbols,&sym->n);

                if (gv->map_file) {
                  if (print_symbols_of_header)
                    fprintf(gv->map_file,"\nSymbols of %s:\n",ls->name);
                  print_symbol(gv->map_file,sym);
                  print_symbols_of_header = FALSE;
                }
              }
            }
          }
        }
      }
    }
  }

  if (gv->use_ldscript && maxls!=NULL) {
    /* put remaining absolute linker script symbols into the
       symbol list of the largest defined section: */
    if (gv->map_file)
      fprintf(gv->map_file,"\nLinker symbols:\n");
    while (sym = (struct Symbol *)remhead(&gv->scriptsymbols)) {
      if (!((sym->flags & (SYMF_REFERENCED|SYMF_PROVIDED))
            == SYMF_PROVIDED)) {
        sym->relsect = (struct Section *)maxls->sections.first;
        addtail(&maxls->symbols,&sym->n);
        if (gv->map_file)
          print_symbol(gv->map_file,sym);
      }
    }
  }

  /* last chance to fix linker symbols */
  fixlnksymbols(gv,maxls);

  /* fix offsets of relocatable debugging symbols */
  for (obj=(struct ObjectUnit *)gv->selobjects.first;
       obj->n.next!=NULL; obj=(struct ObjectUnit *)obj->n.next) {
    fixstabs(obj);
  }
}